

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder.c
# Opt level: O2

HPDF_STATUS HPDF_CMapEncoder_AddCMap(HPDF_Encoder encoder,HPDF_CidRange_Rec *range)

{
  void *pvVar1;
  HPDF_UINT16 code;
  uint uVar2;
  undefined4 *item;
  HPDF_STATUS HVar3;
  HPDF_UINT16 HVar4;
  
  pvVar1 = encoder->attr;
  while( true ) {
    uVar2 = (uint)range->from;
    if ((range->from == 0xffff) && (range->to == 0xffff)) {
      return 0;
    }
    if (encoder->to_unicode_fn == HPDF_CMapEncoder_ToUnicode) {
      HVar4 = range->cid;
      for (; (ushort)uVar2 <= range->to; uVar2 = uVar2 + 1) {
        *(HPDF_UINT16 *)
         ((long)pvVar1 + (ulong)(uVar2 >> 8 & 0xff) * 2 + (ulong)((uVar2 & 0xff) << 9) + 0x20000) =
             HVar4;
        HVar4 = HVar4 + 1;
      }
    }
    item = (undefined4 *)HPDF_GetMem(encoder->mmgr,6);
    if (item == (undefined4 *)0x0) break;
    *item = *(undefined4 *)range;
    *(HPDF_UINT16 *)(item + 1) = range->cid;
    HVar3 = HPDF_List_Add(*(HPDF_List *)((long)pvVar1 + 0x40100),item);
    range = range + 1;
    if (HVar3 != 0) {
      HPDF_FreeMem(encoder->mmgr,item);
      return HVar3;
    }
  }
  return encoder->error->error_no;
}

Assistant:

HPDF_STATUS
HPDF_CMapEncoder_AddCMap  (HPDF_Encoder             encoder,
                           const HPDF_CidRange_Rec  *range)
{
    HPDF_CMapEncoderAttr attr = (HPDF_CMapEncoderAttr)encoder->attr;

    HPDF_PTRACE ((" HPDF_CMapEncoder_AddCMap\n"));

    /* Copy specified pdf_cid_range array to fRangeArray. */
    while (range->from != 0xffff || range->to != 0xffff) {
        HPDF_CidRange_Rec *prange;
        HPDF_STATUS ret;

        /*
         * Only if we have the default to_unicode_fn
         */
        if (encoder->to_unicode_fn == HPDF_CMapEncoder_ToUnicode) {
            HPDF_UINT16 code = range->from;
            HPDF_UINT16 cid = range->cid;

            while (code <= range->to) {
                HPDF_BYTE l = (HPDF_BYTE)code;
                HPDF_BYTE h = code >> 8;

                attr->cid_map[l][h] = cid;
                code++;
                cid++;
            }
        }

        prange = HPDF_GetMem (encoder->mmgr, sizeof(HPDF_CidRange_Rec));
        if (!prange)
            return encoder->error->error_no;

        prange->from = range->from;
        prange->to = range->to;
        prange->cid = range->cid;

        if ((ret = HPDF_List_Add (attr->cmap_range, prange)) != HPDF_OK) {
            HPDF_FreeMem (encoder->mmgr, prange);
            return ret;
        }

        range++;
    }

    return HPDF_OK;
}